

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::ColorEdit3(char *label,float *col)

{
  bool bVar1;
  undefined8 local_28;
  float local_20;
  undefined4 local_1c;
  
  local_28 = *(undefined8 *)col;
  local_20 = col[2];
  local_1c = 0x3f800000;
  bVar1 = ColorEdit4(label,(float *)&local_28,false);
  *(undefined8 *)col = local_28;
  col[2] = local_20;
  return bVar1;
}

Assistant:

bool ImGui::ColorEdit3(const char* label, float col[3])
{
    float col4[4];
    col4[0] = col[0];
    col4[1] = col[1];
    col4[2] = col[2];
    col4[3] = 1.0f;
    const bool value_changed = ColorEdit4(label, col4, false);
    col[0] = col4[0];
    col[1] = col4[1];
    col[2] = col4[2];
    return value_changed;
}